

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O2

bool am_find_proto_and_name(Am_Object *target_obj,Am_Assoc *answer)

{
  bool bVar1;
  bool bVar2;
  Am_Value *in_value;
  Am_Object this_proto;
  Am_Object local_58;
  Am_Object *local_50;
  Am_Object local_48;
  Am_Value local_40;
  
  local_58.data = (Am_Object_Data *)0x0;
  local_50 = target_obj;
  Am_Value_List::Start(&am_all_proto_names);
  while( true ) {
    bVar1 = Am_Value_List::Last(&am_all_proto_names);
    if (bVar1) break;
    in_value = Am_Value_List::Get(&am_all_proto_names);
    Am_Assoc::operator=(answer,in_value);
    Am_Assoc::Value_2((Am_Assoc *)&local_40);
    Am_Object::operator=(&local_58,&local_40);
    Am_Value::~Am_Value(&local_40);
    Am_Object::Am_Object(&local_48,&local_58);
    bVar2 = Am_Object::Is_Instance_Of(local_50,&local_48);
    Am_Object::~Am_Object(&local_48);
    if (bVar2) break;
    Am_Value_List::Next(&am_all_proto_names);
  }
  Am_Object::~Am_Object(&local_58);
  return !bVar1;
}

Assistant:

bool
am_find_proto_and_name(Am_Object &target_obj, Am_Assoc &answer)
{
  Am_Object this_proto;
  for (am_all_proto_names.Start(); !am_all_proto_names.Last();
       am_all_proto_names.Next()) {
    answer = am_all_proto_names.Get();
    this_proto = answer.Value_2();
    if (target_obj.Is_Instance_Of(this_proto)) {
      return true;
    }
  }
  return false;
}